

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatformTest.cpp
# Opt level: O0

void __thiscall
TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_FailureInSeparateProcessWorks_Test
::testBody(TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_FailureInSeparateProcessWorks_Test
           *this)

{
  TestTestingFixture *this_00;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_FailureInSeparateProcessWorks_Test
  *local_10;
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_FailureInSeparateProcessWorks_Test
  *this_local;
  
  this_00 = &(this->
             super_TEST_GROUP_CppUTestGroupUTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess
             ).fixture;
  local_10 = this;
  TestTestingFixture::setRunTestsInSeperateProcess(this_00);
  TestTestingFixture::setTestFunction(this_00,failFunction_);
  TestTestingFixture::runAllTests(this_00);
  SimpleString::SimpleString(&local_20,"Failed in separate process");
  TestTestingFixture::assertPrintContains(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString
            (local_40,"Errors (1 failures, 1 tests, 1 ran, 0 checks, 0 ignored, 0 filtered out");
  TestTestingFixture::assertPrintContains
            (&(this->
              super_TEST_GROUP_CppUTestGroupUTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess
              ).fixture,local_40);
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

TEST(UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess, FailureInSeparateProcessWorks)
{
    fixture.setRunTestsInSeperateProcess();
    fixture.setTestFunction(failFunction_);
    fixture.runAllTests();
    fixture.assertPrintContains("Failed in separate process");
    fixture.assertPrintContains("Errors (1 failures, 1 tests, 1 ran, 0 checks, 0 ignored, 0 filtered out");
}